

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  int iVar1;
  const_iterator cVar2;
  ostream *poVar3;
  string *this;
  long lVar4;
  string_view str;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  string val;
  string local_70;
  string local_50 [32];
  
  if (name->_M_string_length == 0) {
    cmStrCat<char_const(&)[55],std::__cxx11::string_const&>
              (&local_70,(char (*) [55])"No name given for WriteVariable! called with comment: ",
               comment);
    cmSystemTools::Error(&local_70);
    this = &local_70;
  }
  else {
    val._M_dataplus._M_p = (pointer)&val.field_2;
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    if (WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
        ::variablesShouldNotBeTrimmed_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                                   ::variablesShouldNotBeTrimmed_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"CODE_CHECK",&local_91);
        std::__cxx11::string::string<std::allocator<char>>(local_50,"LAUNCHER",&local_92);
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_Hashtable<std::__cxx11::string_const*>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                       ::variablesShouldNotBeTrimmed_abi_cxx11_,&local_70,&stack0xffffffffffffffd0,0
                   ,&local_93,&local_94,&local_95);
        lVar4 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&local_70._M_dataplus._M_p + lVar4));
          lVar4 = lVar4 + -0x20;
        } while (lVar4 != -0x20);
        __cxa_atexit(std::
                     unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~unordered_set,
                     &WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                      ::variablesShouldNotBeTrimmed_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                             ::variablesShouldNotBeTrimmed_abi_cxx11_);
      }
    }
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&WriteVariable(std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,int)
                    ::variablesShouldNotBeTrimmed_abi_cxx11_._M_h,name);
    if (cVar2.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      str._M_str = (value->_M_dataplus)._M_p;
      str._M_len = value->_M_string_length;
      cmTrimWhitespace_abi_cxx11_(&local_70,str);
      std::__cxx11::string::operator=((string *)&val,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&val);
    }
    if (val._M_string_length != 0) {
      WriteComment(os,comment);
      Indent(os,indent);
      poVar3 = std::operator<<(os,(string *)name);
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::operator<<(poVar3,(string *)&val);
      std::operator<<(poVar3,"\n");
    }
    this = &val;
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if (name.empty()) {
    cmSystemTools::Error(cmStrCat("No name given for WriteVariable! called "
                                  "with comment: ",
                                  comment));
    return;
  }

  std::string val;
  static std::unordered_set<std::string> const variablesShouldNotBeTrimmed = {
    "CODE_CHECK", "LAUNCHER"
  };
  if (variablesShouldNotBeTrimmed.find(name) ==
      variablesShouldNotBeTrimmed.end()) {
    val = cmTrimWhitespace(value);
  } else {
    val = value;
  }

  // Do not add a variable if the value is empty.
  if (val.empty()) {
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}